

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pipelines.cpp
# Opt level: O0

void three_parallel_pipelines(size_t L,uint w)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>
  *ps_1;
  Task *pTVar1;
  uint in_ESI;
  Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
  *in_RDI;
  Task terminal;
  Task initial;
  Task test3;
  Task pipeline3;
  Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>
  pl3;
  size_t cnt3;
  vector<int,_std::allocator<int>_> collection3_2;
  mutex mutex3_2;
  atomic<unsigned_long> j3_2;
  size_t j3_1;
  Task test2;
  Task pipeline2;
  Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1131:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1142:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1150:40)>_>
  pl2;
  size_t cnt2;
  vector<int,_std::allocator<int>_> collection2_3;
  mutex mutex2_3;
  atomic<unsigned_long> j2_3;
  size_t j2_2;
  size_t j2_1;
  Task test1;
  Task pipeline1;
  Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
  pl1;
  size_t cnt1;
  size_t j1_4;
  size_t j1_3;
  size_t j1_2;
  size_t j1_1;
  Taskflow taskflow;
  size_t N;
  vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> mybuffer3;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> mybuffer2;
  vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> mybuffer1;
  vector<int,_std::allocator<int>_> source;
  size_t maxN;
  Executor executor;
  undefined4 in_stack_ffffffffffffef98;
  PipeType in_stack_ffffffffffffef9c;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffefa0;
  Taskflow *in_stack_ffffffffffffefb0;
  size_type in_stack_ffffffffffffefb8;
  Executor *this;
  Taskflow *in_stack_ffffffffffffefc0;
  Executor *in_stack_ffffffffffffefd0;
  allocator<char> *in_stack_ffffffffffffefd8;
  Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
  *in_stack_ffffffffffffefe0;
  FlowBuilder *in_stack_ffffffffffffefe8;
  Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
  *ps_1_00;
  Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1150:40)>
  *ps_2;
  Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
  *ps_1_01;
  Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>
  *this_00;
  Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>
  *ps_3;
  Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1131:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1142:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1150:40)>_>
  *this_01;
  Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>
  *ps;
  shared_ptr<tf::WorkerInterface> *in_stack_fffffffffffff088;
  Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
  *in_stack_fffffffffffff090;
  Executor *in_stack_fffffffffffff098;
  undefined8 local_ec9;
  Task local_e98;
  undefined1 local_e89 [49];
  Task local_e58;
  allocator<char> local_e49;
  string local_e48 [32];
  undefined8 *local_e28;
  ulong *local_e20;
  undefined8 *local_e18;
  undefined1 *local_e10;
  undefined1 *local_e08;
  undefined8 *local_e00;
  Task local_df0;
  allocator<char> local_de1;
  string local_de0 [40];
  Task local_db8;
  ulong local_db0;
  undefined1 *local_da8;
  undefined1 *local_da0;
  undefined8 *local_d98;
  undefined1 *local_d90;
  Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
  *local_d88;
  ulong local_d48;
  undefined1 *local_d40;
  undefined8 *local_d38;
  undefined1 *local_d30;
  Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
  *local_d28;
  undefined1 local_cf0 [416];
  undefined8 local_b50;
  undefined1 local_b48 [24];
  undefined1 local_b30 [40];
  undefined8 local_b08;
  undefined8 local_b00;
  allocator<char> local_af1;
  string local_af0 [32];
  undefined8 *local_ad0;
  ulong *local_ac8;
  undefined8 *local_ac0;
  undefined8 *local_ab8;
  undefined1 *local_ab0;
  undefined1 *local_aa8;
  undefined8 *local_aa0;
  Task local_a90;
  allocator<char> local_a81;
  string local_a80 [40];
  Task local_a58;
  ulong local_a50;
  undefined8 *local_a48;
  undefined1 *local_a40;
  undefined1 *local_a38;
  undefined1 *local_a30;
  Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
  *local_a28;
  ulong local_9e8;
  undefined1 *local_9e0;
  undefined8 *local_9d8;
  undefined1 *local_9d0;
  Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
  *local_9c8;
  ulong local_990;
  undefined1 *local_988;
  undefined8 *local_980;
  undefined1 *local_978;
  Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
  *local_970;
  undefined1 local_938 [472];
  undefined8 local_760;
  undefined1 local_758 [24];
  undefined1 local_740 [40];
  undefined8 local_718;
  undefined8 local_710;
  undefined8 local_708;
  allocator<char> local_6f9;
  string local_6f8 [32];
  undefined1 *local_6d8;
  ulong *local_6d0;
  undefined1 *local_6c8;
  undefined8 *local_6c0;
  undefined8 *local_6b8;
  undefined1 *local_6b0;
  undefined8 *local_6a8;
  Task local_698;
  allocator<char> local_689;
  string local_688 [40];
  Task local_660;
  ulong local_658;
  undefined1 *local_650;
  undefined8 *local_648;
  undefined1 *local_640;
  Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
  *local_638;
  ulong local_600;
  undefined1 *local_5f8;
  undefined8 *local_5f0;
  undefined1 *local_5e8;
  Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
  *local_5e0;
  ulong local_5a8;
  undefined1 *local_5a0;
  undefined1 *local_598;
  undefined1 *local_590;
  Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
  *local_588;
  ulong local_550;
  undefined1 *local_548;
  undefined1 *local_540;
  undefined1 *local_538;
  Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
  *local_530;
  undefined1 local_4f8 [512];
  undefined8 local_2f8;
  undefined8 local_2f0;
  undefined8 local_2e8;
  undefined1 local_2e0 [216];
  ulong local_208 [2];
  undefined1 local_1f8 [31];
  undefined1 local_1d9 [33];
  undefined1 local_1b8 [24];
  int *local_1a0;
  _Elt_pointer local_198;
  undefined1 local_189 [25];
  _Elt_pointer local_170;
  Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>
  local_158 [7];
  Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
  *local_8;
  
  ps_1 = (Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>
          *)(ulong)in_ESI;
  ps = local_158;
  local_8 = in_RDI;
  std::shared_ptr<tf::WorkerInterface>::shared_ptr
            ((shared_ptr<tf::WorkerInterface> *)in_stack_ffffffffffffefa0._M_current,
             (nullptr_t)CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98));
  tf::Executor::Executor
            (in_stack_fffffffffffff098,(size_t)in_stack_fffffffffffff090,in_stack_fffffffffffff088);
  std::shared_ptr<tf::WorkerInterface>::~shared_ptr((shared_ptr<tf::WorkerInterface> *)0x12d06a);
  local_170 = (_Elt_pointer)0x64;
  this_01 = (Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1131:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1142:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1150:40)>_>
             *)local_189;
  std::allocator<int>::allocator((allocator<int> *)0x12d08b);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffefc0,
             in_stack_ffffffffffffefb8,(allocator_type *)in_stack_ffffffffffffefb0);
  std::allocator<int>::~allocator((allocator<int> *)0x12d0b4);
  ps_3 = (Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>
          *)(local_189 + 1);
  local_198 = (_Elt_pointer)
              std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)
                         CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98));
  local_1a0 = (int *)std::vector<int,_std::allocator<int>_>::end
                               ((vector<int,_std::allocator<int>_> *)
                                CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98));
  __last._M_current._4_4_ = in_stack_ffffffffffffef9c;
  __last._M_current._0_4_ = in_stack_ffffffffffffef98;
  std::iota<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
            (in_stack_ffffffffffffefa0,__last,0);
  this_00 = (Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>
             *)(local_1d9 + 0x20);
  ps_1_01 = local_8;
  std::allocator<std::array<int,_4UL>_>::allocator((allocator<std::array<int,_4UL>_> *)0x12d124);
  std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::vector
            ((vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)
             in_stack_ffffffffffffefc0,in_stack_ffffffffffffefb8,
             (allocator_type *)in_stack_ffffffffffffefb0);
  std::allocator<std::array<int,_4UL>_>::~allocator((allocator<std::array<int,_4UL>_> *)0x12d150);
  ps_2 = (Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1150:40)>
          *)local_1d9;
  ps_1_00 = local_8;
  std::allocator<std::array<int,_3UL>_>::allocator((allocator<std::array<int,_3UL>_> *)0x12d175);
  std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::vector
            ((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
             in_stack_ffffffffffffefc0,in_stack_ffffffffffffefb8,
             (allocator_type *)in_stack_ffffffffffffefb0);
  std::allocator<std::array<int,_3UL>_>::~allocator((allocator<std::array<int,_3UL>_> *)0x12d1a1);
  std::allocator<std::array<int,_2UL>_>::allocator((allocator<std::array<int,_2UL>_> *)0x12d1c6);
  std::vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>::vector
            ((vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)
             in_stack_ffffffffffffefc0,in_stack_ffffffffffffefb8,
             (allocator_type *)in_stack_ffffffffffffefb0);
  std::allocator<std::array<int,_2UL>_>::~allocator((allocator<std::array<int,_2UL>_> *)0x12d1f2);
  for (local_208[0] = 0; local_208[0] < 0x65; local_208[0] = local_208[0] + 1) {
    tf::Taskflow::Taskflow(in_stack_ffffffffffffefc0);
    local_2e0._8_8_ = (pointer)0x0;
    local_2e0._0_8_ = (pointer)0x0;
    local_2e8 = 0;
    local_2f0 = 0;
    local_2f8 = 1;
    local_550 = local_208[0];
    local_548 = local_189 + 1;
    local_540 = local_2e0 + 8;
    local_538 = local_1b8;
    local_530 = local_8;
    tf::
    Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:1074:38)>
    ::Pipe((Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>
            *)in_stack_ffffffffffffefa0._M_current,in_stack_ffffffffffffef9c,
           (anon_class_40_5_c7d58bd3_for__callable *)0x12d2d2);
    local_5a8 = local_208[0];
    local_5a0 = local_189 + 1;
    local_598 = local_2e0;
    local_590 = local_1b8;
    local_588 = local_8;
    tf::
    Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:1085:38)>
    ::Pipe((Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>
            *)in_stack_ffffffffffffefa0._M_current,in_stack_ffffffffffffef9c,
           (anon_class_40_5_c7d58f94_for__callable *)0x12d33e);
    local_600 = local_208[0];
    local_5f8 = local_189 + 1;
    local_5f0 = &local_2e8;
    local_5e8 = local_1b8;
    local_5e0 = local_8;
    tf::
    Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:1093:38)>
    ::Pipe((Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>
            *)in_stack_ffffffffffffefa0._M_current,in_stack_ffffffffffffef9c,
           (anon_class_40_5_c7d59355_for__callable *)0x12d3aa);
    local_658 = local_208[0];
    local_650 = local_189 + 1;
    local_648 = &local_2f0;
    local_640 = local_1b8;
    local_638 = local_8;
    tf::
    Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:1101:38)>
    ::Pipe((Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>
            *)in_stack_ffffffffffffefa0._M_current,in_stack_ffffffffffffef9c,
           (anon_class_40_5_c7d59716_for__callable *)0x12d416);
    tf::
    Pipeline<tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:1074:38)>,_tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:1085:38)>,_tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:1093:38)>,_tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:1101:38)>_>
    ::Pipeline(in_stack_fffffffffffff090,(size_t)in_stack_fffffffffffff088,ps,ps_1,
               (Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>
                *)this_01,ps_3);
    tf::FlowBuilder::
    composed_of<tf::Pipeline<tf::Pipe<three_parallel_pipelines(unsigned_long,unsigned_int)::__0>,tf::Pipe<three_parallel_pipelines(unsigned_long,unsigned_int)::__1>,tf::Pipe<three_parallel_pipelines(unsigned_long,unsigned_int)::__2>,tf::Pipe<three_parallel_pipelines(unsigned_long,unsigned_int)::__3>>>
              (in_stack_ffffffffffffefe8,in_stack_ffffffffffffefe0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffefe0,(char *)in_stack_ffffffffffffefd8,
               (allocator<char> *)in_stack_ffffffffffffefd0);
    pTVar1 = tf::Task::name((Task *)in_stack_ffffffffffffefa0._M_current,
                            (string *)CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98))
    ;
    tf::Task::Task(&local_660,pTVar1);
    std::__cxx11::string::~string(local_688);
    std::allocator<char>::~allocator(&local_689);
    local_6d8 = local_2e0 + 8;
    local_6d0 = local_208;
    local_6c8 = local_2e0;
    local_6c0 = &local_2e8;
    local_6b8 = &local_2f0;
    local_6b0 = local_4f8;
    local_6a8 = &local_2f8;
    tf::FlowBuilder::
    emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1110:35),_nullptr>
              (in_stack_ffffffffffffefe8,(anon_class_56_7_e8780f52 *)in_stack_ffffffffffffefe0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffefe0,(char *)in_stack_ffffffffffffefd8,
               (allocator<char> *)in_stack_ffffffffffffefd0);
    pTVar1 = tf::Task::name((Task *)in_stack_ffffffffffffefa0._M_current,
                            (string *)CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98))
    ;
    tf::Task::Task(&local_698,pTVar1);
    std::__cxx11::string::~string(local_6f8);
    std::allocator<char>::~allocator(&local_6f9);
    tf::Task::precede<tf::Task&>
              ((Task *)in_stack_ffffffffffffefa0._M_current,
               (Task *)CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98));
    local_708 = 0;
    local_710 = 0;
    local_718 = 0;
    std::mutex::mutex((mutex *)0x12d645);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x12d652);
    local_760 = 1;
    local_990 = local_208[0];
    local_988 = local_189 + 1;
    local_980 = &local_708;
    local_978 = local_1d9 + 1;
    local_970 = local_8;
    tf::
    Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:1131:38)>
    ::Pipe((Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1131:38)>
            *)in_stack_ffffffffffffefa0._M_current,in_stack_ffffffffffffef9c,
           (anon_class_40_5_c7e3a373_for__callable *)0x12d6d5);
    local_9e8 = local_208[0];
    local_9e0 = local_189 + 1;
    local_9d8 = &local_710;
    local_9d0 = local_1d9 + 1;
    local_9c8 = local_8;
    tf::
    Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:1142:38)>
    ::Pipe((Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1142:38)>
            *)in_stack_ffffffffffffefa0._M_current,in_stack_ffffffffffffef9c,
           (anon_class_40_5_c7e3a734_for__callable *)0x12d741);
    local_a50 = local_208[0];
    local_a48 = &local_718;
    local_a40 = local_740;
    local_a38 = local_758;
    local_a30 = local_1d9 + 1;
    local_a28 = local_8;
    tf::
    Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:1150:40)>
    ::Pipe((Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1150:40)>
            *)in_stack_ffffffffffffefa0._M_current,in_stack_ffffffffffffef9c,
           (anon_class_48_6_f37db3fc_for__callable *)0x12d7bd);
    tf::
    Pipeline<tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:1131:38)>,_tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:1142:38)>,_tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:1150:40)>_>
    ::Pipeline(this_01,(size_t)ps_3,
               (Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1131:38)>
                *)this_00,
               (Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1142:38)>
                *)ps_1_01,ps_2);
    tf::FlowBuilder::
    composed_of<tf::Pipeline<tf::Pipe<three_parallel_pipelines(unsigned_long,unsigned_int)::__5>,tf::Pipe<three_parallel_pipelines(unsigned_long,unsigned_int)::__6>,tf::Pipe<three_parallel_pipelines(unsigned_long,unsigned_int)::__7>>>
              (in_stack_ffffffffffffefe8,
               (Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1131:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1142:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1150:40)>_>
                *)in_stack_ffffffffffffefe0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffefe0,(char *)in_stack_ffffffffffffefd8,
               (allocator<char> *)in_stack_ffffffffffffefd0);
    pTVar1 = tf::Task::name((Task *)in_stack_ffffffffffffefa0._M_current,
                            (string *)CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98))
    ;
    tf::Task::Task(&local_a58,pTVar1);
    std::__cxx11::string::~string(local_a80);
    std::allocator<char>::~allocator(&local_a81);
    local_ad0 = &local_708;
    local_ac8 = local_208;
    local_ac0 = &local_710;
    local_ab8 = &local_718;
    local_ab0 = local_758;
    local_aa8 = local_938;
    local_aa0 = &local_760;
    tf::FlowBuilder::
    emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1161:35),_nullptr>
              (in_stack_ffffffffffffefe8,(anon_class_56_7_a65f8f3d *)in_stack_ffffffffffffefe0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffefe0,(char *)in_stack_ffffffffffffefd8,
               (allocator<char> *)in_stack_ffffffffffffefd0);
    in_stack_ffffffffffffefe8 =
         (FlowBuilder *)
         tf::Task::name((Task *)in_stack_ffffffffffffefa0._M_current,
                        (string *)CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98));
    tf::Task::Task(&local_a90,(Task *)in_stack_ffffffffffffefe8);
    std::__cxx11::string::~string(local_af0);
    std::allocator<char>::~allocator(&local_af1);
    tf::Task::precede<tf::Task&>
              ((Task *)in_stack_ffffffffffffefa0._M_current,
               (Task *)CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98));
    local_b00 = 0;
    local_b08 = 0;
    std::mutex::mutex((mutex *)0x12d9c3);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x12d9d0);
    local_b50 = 1;
    local_d48 = local_208[0];
    local_d40 = local_189 + 1;
    local_d38 = &local_b00;
    local_d30 = local_1f8;
    local_d28 = local_8;
    in_stack_ffffffffffffefe0 = local_8;
    tf::
    Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:1187:38)>
    ::Pipe((Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>
            *)in_stack_ffffffffffffefa0._M_current,in_stack_ffffffffffffef9c,
           (anon_class_40_5_c7f1bb13_for__callable *)0x12da53);
    local_db0 = local_208[0];
    local_da8 = local_b48;
    local_da0 = local_b30;
    local_d98 = &local_b08;
    local_d90 = local_1f8;
    local_d88 = local_8;
    tf::
    Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:1199:7)>
    ::Pipe((Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>
            *)in_stack_ffffffffffffefa0._M_current,in_stack_ffffffffffffef9c,
           (anon_class_48_6_62d7d53d_for__callable *)0x12dacf);
    tf::
    Pipeline<tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:1187:38)>,_tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:1199:7)>_>
    ::Pipeline(this_00,(size_t)ps_1_01,
               (Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>
                *)ps_2,(Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>
                        *)ps_1_00);
    tf::FlowBuilder::
    composed_of<tf::Pipeline<tf::Pipe<three_parallel_pipelines(unsigned_long,unsigned_int)::__9>,tf::Pipe<three_parallel_pipelines(unsigned_long,unsigned_int)::__10>>>
              (in_stack_ffffffffffffefe8,
               (Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>
                *)in_stack_ffffffffffffefe0);
    in_stack_ffffffffffffefd8 = &local_de1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffefe0,(char *)in_stack_ffffffffffffefd8,
               (allocator<char> *)in_stack_ffffffffffffefd0);
    in_stack_ffffffffffffefd0 =
         (Executor *)
         tf::Task::name((Task *)in_stack_ffffffffffffefa0._M_current,
                        (string *)CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98));
    tf::Task::Task(&local_db8,(Task *)in_stack_ffffffffffffefd0);
    std::__cxx11::string::~string(local_de0);
    std::allocator<char>::~allocator(&local_de1);
    local_e28 = &local_b00;
    local_e20 = local_208;
    local_e18 = &local_b08;
    local_e10 = local_b48;
    local_e08 = local_cf0;
    local_e00 = &local_b50;
    tf::FlowBuilder::
    emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1210:35),_nullptr>
              (in_stack_ffffffffffffefe8,(anon_class_48_6_884024df *)in_stack_ffffffffffffefe0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffefe0,(char *)in_stack_ffffffffffffefd8,
               (allocator<char> *)in_stack_ffffffffffffefd0);
    in_stack_ffffffffffffefc0 =
         (Taskflow *)
         tf::Task::name((Task *)in_stack_ffffffffffffefa0._M_current,
                        (string *)CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98));
    tf::Task::Task(&local_df0,(Task *)in_stack_ffffffffffffefc0);
    std::__cxx11::string::~string(local_e48);
    std::allocator<char>::~allocator(&local_e49);
    tf::Task::precede<tf::Task&>
              ((Task *)in_stack_ffffffffffffefa0._M_current,
               (Task *)CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98));
    tf::FlowBuilder::
    emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1224:38),_nullptr>
              (in_stack_ffffffffffffefe8,(anon_class_1_0_00000001 *)in_stack_ffffffffffffefe0);
    this = (Executor *)local_e89;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffefe0,(char *)in_stack_ffffffffffffefd8,
               (allocator<char> *)in_stack_ffffffffffffefd0);
    in_stack_ffffffffffffefb0 =
         (Taskflow *)
         tf::Task::name((Task *)in_stack_ffffffffffffefa0._M_current,
                        (string *)CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98));
    tf::Task::Task(&local_e58,(Task *)in_stack_ffffffffffffefb0);
    std::__cxx11::string::~string((string *)(local_e89 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_e89);
    tf::FlowBuilder::
    emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1225:38),_nullptr>
              (in_stack_ffffffffffffefe8,(anon_class_1_0_00000001 *)in_stack_ffffffffffffefe0);
    pTVar1 = (Task *)&local_ec9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffefe0,(char *)in_stack_ffffffffffffefd8,
               (allocator<char> *)in_stack_ffffffffffffefd0);
    in_stack_ffffffffffffefa0._M_current =
         (int *)tf::Task::name(in_stack_ffffffffffffefa0._M_current,
                               (string *)
                               CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98));
    tf::Task::Task(&local_e98,(Task *)in_stack_ffffffffffffefa0._M_current);
    std::__cxx11::string::~string((string *)((long)&local_ec9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)&local_ec9);
    tf::Task::precede<tf::Task&,tf::Task&,tf::Task&>
              ((Task *)in_stack_ffffffffffffefb0,pTVar1,(Task *)in_stack_ffffffffffffefa0._M_current
               ,(Task *)CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98));
    tf::Task::succeed<tf::Task&,tf::Task&,tf::Task&>
              ((Task *)in_stack_ffffffffffffefb0,pTVar1,(Task *)in_stack_ffffffffffffefa0._M_current
               ,(Task *)CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98));
    in_stack_fffffffffffff088 = (shared_ptr<tf::WorkerInterface> *)(local_2e0 + 8);
    in_stack_fffffffffffff090 =
         (Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
          *)local_2e0;
    tf::Executor::run_n<three_parallel_pipelines(unsigned_long,unsigned_int)::__14>
              (this,in_stack_ffffffffffffefb0,(size_t)pTVar1,
               (anon_class_136_17_4ca99117 *)in_stack_ffffffffffffefa0._M_current);
    std::future<void>::get((future<void> *)in_stack_ffffffffffffefb0);
    tf::Future<void>::~Future((Future<void> *)in_stack_ffffffffffffefa0._M_current);
    tf::
    Pipeline<tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:1187:38)>,_tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:1199:7)>_>
    ::~Pipeline((Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1187:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1199:7)>_>
                 *)in_stack_ffffffffffffefa0._M_current);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffefb0);
    tf::
    Pipeline<tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:1131:38)>,_tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:1142:38)>,_tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:1150:40)>_>
    ::~Pipeline((Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1131:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1142:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1150:40)>_>
                 *)in_stack_ffffffffffffefa0._M_current);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffefb0);
    tf::
    Pipeline<tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:1074:38)>,_tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:1085:38)>,_tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:1093:38)>,_tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:1101:38)>_>
    ::~Pipeline((Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1074:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1085:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1093:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:1101:38)>_>
                 *)in_stack_ffffffffffffefa0._M_current);
    tf::Taskflow::~Taskflow((Taskflow *)in_stack_ffffffffffffefa0._M_current);
  }
  std::vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>::~vector
            ((vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)
             in_stack_ffffffffffffefb0);
  std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::~vector
            ((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
             in_stack_ffffffffffffefb0);
  std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::~vector
            ((vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)
             in_stack_ffffffffffffefb0);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffefb0);
  tf::Executor::~Executor(in_stack_ffffffffffffefd0);
  return;
}

Assistant:

void three_parallel_pipelines(size_t L, unsigned w) {

  tf::Executor executor(w);

  const size_t maxN = 100;

  std::vector<int> source(maxN);
  std::iota(source.begin(), source.end(), 0);
  std::vector<std::array<int, 4>> mybuffer1(L);
  std::vector<std::array<int, 3>> mybuffer2(L);
  std::vector<std::array<int, 2>> mybuffer3(L);

  for(size_t N = 0; N <= maxN; N++) {

    tf::Taskflow taskflow;

    size_t j1_1 = 0, j1_2 = 0, j1_3 = 0, j1_4 = 0;
    size_t cnt1 = 1;

    // pipeline 1 is SSSS
    tf::Pipeline pl1(L,
      tf::Pipe{tf::PipeType::SERIAL, [N, &source, &j1_1, &mybuffer1, L](auto& pf) mutable {
        if(j1_1 == N) {
          pf.stop();
          return;
        }
        REQUIRE(j1_1 == source[j1_1]);
        REQUIRE(pf.token() % L == pf.line());
        mybuffer1[pf.line()][pf.pipe()] = source[j1_1] + 1;
        j1_1++;
      }},

      tf::Pipe{tf::PipeType::SERIAL, [N, &source, &j1_2, &mybuffer1, L](auto& pf) mutable {
        REQUIRE(j1_2 < N);
        REQUIRE(pf.token() % L == pf.line());
        REQUIRE(source[j1_2] + 1 == mybuffer1[pf.line()][pf.pipe() - 1]);
        mybuffer1[pf.line()][pf.pipe()] = source[j1_2] + 1;
        j1_2++;
      }},

      tf::Pipe{tf::PipeType::SERIAL, [N, &source, &j1_3, &mybuffer1, L](auto& pf) mutable {
        REQUIRE(j1_3 < N);
        REQUIRE(pf.token() % L == pf.line());
        REQUIRE(source[j1_3] + 1 == mybuffer1[pf.line()][pf.pipe() - 1]);
        mybuffer1[pf.line()][pf.pipe()] = source[j1_3] + 1;
        j1_3++;
      }},

      tf::Pipe{tf::PipeType::SERIAL, [N, &source, &j1_4, &mybuffer1, L](auto& pf) mutable {
        REQUIRE(j1_4 < N);
        REQUIRE(pf.token() % L == pf.line());
        REQUIRE(source[j1_4] + 1 == mybuffer1[pf.line()][pf.pipe() - 1]);
        j1_4++;
      }}
    );

    auto pipeline1 = taskflow.composed_of(pl1).name("module_of_pipeline1");
    auto test1 = taskflow.emplace([&](){
      REQUIRE(j1_1 == N);
      REQUIRE(j1_2 == N);
      REQUIRE(j1_3 == N);
      REQUIRE(j1_4 == N);
      REQUIRE(pl1.num_tokens() == cnt1 * N);
    }).name("test1");

    pipeline1.precede(test1);



    // the followings are definitions for pipeline 2
    size_t j2_1 = 0, j2_2 = 0;
    std::atomic<size_t> j2_3 = 0;
    std::mutex mutex2_3;
    std::vector<int> collection2_3;
    size_t cnt2 = 1;

    // pipeline 2 is SSP
    tf::Pipeline pl2(L,
      tf::Pipe{tf::PipeType::SERIAL, [N, &source, &j2_1, &mybuffer2, L](auto& pf) mutable {
        if(j2_1 == N) {
          pf.stop();
          return;
        }
        REQUIRE(j2_1 == source[j2_1]);
        REQUIRE(pf.token() % L == pf.line());
        mybuffer2[pf.line()][pf.pipe()] = source[j2_1] + 1;
        j2_1++;
      }},

      tf::Pipe{tf::PipeType::SERIAL, [N, &source, &j2_2, &mybuffer2, L](auto& pf) mutable {
        REQUIRE(j2_2 < N);
        REQUIRE(source[j2_2] + 1 == mybuffer2[pf.line()][pf.pipe() - 1]);
        REQUIRE(pf.token() % L == pf.line());
        mybuffer2[pf.line()][pf.pipe()] = source[j2_2] + 1;
        j2_2++;
      }},

      tf::Pipe{tf::PipeType::PARALLEL, [N, &j2_3, &mutex2_3, &collection2_3, &mybuffer2, L](auto& pf) mutable {
        REQUIRE(j2_3++ < N);
        {
          std::scoped_lock<std::mutex> lock(mutex2_3);
          REQUIRE(pf.token() % L == pf.line());
          collection2_3.push_back(mybuffer2[pf.line()][pf.pipe() - 1]);
        }
      }}
    );

    auto pipeline2 = taskflow.composed_of(pl2).name("module_of_pipeline2");
    auto test2 = taskflow.emplace([&](){
      REQUIRE(j2_1 == N);
      REQUIRE(j2_2 == N);
      REQUIRE(j2_3 == N);
      REQUIRE(collection2_3.size() == N);

      std::sort(collection2_3.begin(), collection2_3.end());
      for (size_t i = 0; i < N; ++i) {
        REQUIRE(collection2_3[i] == i + 1);
      }
      REQUIRE(pl2.num_tokens() == cnt2 * N);
    }).name("test2");

    pipeline2.precede(test2);



    // the followings are definitions for pipeline 3
    size_t j3_1 = 0;
    std::atomic<size_t> j3_2 = 0;
    std::mutex mutex3_2;
    std::vector<int> collection3_2;
    size_t cnt3 = 1;

    // pipeline 3 is SP
    tf::Pipeline pl3(L,
      tf::Pipe{tf::PipeType::SERIAL, [N, &source, &j3_1, &mybuffer3, L](auto& pf) mutable {
        if(j3_1 == N) {
          pf.stop();
          return;
        }
        REQUIRE(j3_1 == source[j3_1]);
        REQUIRE(pf.token() % L == pf.line());
        mybuffer3[pf.line()][pf.pipe()] = source[j3_1] + 1;
        j3_1++;
      }},

      tf::Pipe{tf::PipeType::PARALLEL,
      [N, &collection3_2, &mutex3_2, &j3_2, &mybuffer3, L](auto& pf) mutable {
        REQUIRE(j3_2++ < N);
        {
          std::scoped_lock<std::mutex> lock(mutex3_2);
          REQUIRE(pf.token() % L == pf.line());
          collection3_2.push_back(mybuffer3[pf.line()][pf.pipe() - 1]);
        }
      }}
    );

    auto pipeline3 = taskflow.composed_of(pl3).name("module_of_pipeline3");
    auto test3 = taskflow.emplace([&](){
      REQUIRE(j3_1 == N);
      REQUIRE(j3_2 == N);

      std::sort(collection3_2.begin(), collection3_2.end());
      for(size_t i = 0; i < N; i++) {
        REQUIRE(collection3_2[i] == i + 1);
      }
      REQUIRE(pl3.num_tokens() == cnt3 * N);
    }).name("test3");

    pipeline3.precede(test3);


    auto initial  = taskflow.emplace([](){}).name("initial");
    auto terminal = taskflow.emplace([](){}).name("terminal");

    initial.precede(pipeline1, pipeline2, pipeline3);
    terminal.succeed(test1, test2, test3);

    //taskflow.dump(std::cout);

    executor.run_n(taskflow, 3, [&]() mutable {
      // reset variables for pipeline 1
      j1_1 = j1_2 = j1_3 = j1_4 = 0;
      for(size_t i = 0; i < mybuffer1.size(); ++i){
        for(size_t j = 0; j < mybuffer1[0].size(); ++j){
          mybuffer1[i][j] = 0;
        }
      }
      cnt1++;

      // reset variables for pipeline 2
      j2_1 = j2_2 = j2_3 = 0;
      collection2_3.clear();
      for(size_t i = 0; i < mybuffer2.size(); ++i){
        for(size_t j = 0; j < mybuffer2[0].size(); ++j){
          mybuffer2[i][j] = 0;
        }
      }
      cnt2++;

      // reset variables for pipeline 3
      j3_1 = j3_2 = 0;
      collection3_2.clear();
      for(size_t i = 0; i < mybuffer3.size(); ++i){
        for(size_t j = 0; j < mybuffer3[0].size(); ++j){
          mybuffer3[i][j] = 0;
        }
      }
      cnt3++;
    }).get();


  }
}